

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O1

SW_FT_Error
SW_FT_Stroker_GetCounts(SW_FT_Stroker stroker,SW_FT_UInt *anum_points,SW_FT_UInt *anum_contours)

{
  SW_FT_UInt count1;
  SW_FT_UInt count4;
  SW_FT_UInt count3;
  SW_FT_UInt count2;
  SW_FT_UInt local_40;
  SW_FT_UInt local_3c;
  SW_FT_UInt local_38;
  SW_FT_UInt local_34;
  
  ft_stroke_border_get_counts(stroker->borders,&local_40,&local_34);
  ft_stroke_border_get_counts(stroker->borders + 1,&local_38,&local_3c);
  *anum_points = local_38 + local_40;
  *anum_contours = local_3c + local_34;
  return 0;
}

Assistant:

SW_FT_Error SW_FT_Stroker_GetCounts(SW_FT_Stroker stroker,
                                    SW_FT_UInt*   anum_points,
                                    SW_FT_UInt*   anum_contours)
{
    SW_FT_UInt  count1, count2, num_points = 0;
    SW_FT_UInt  count3, count4, num_contours = 0;
    SW_FT_Error error;

    error = ft_stroke_border_get_counts(stroker->borders + 0, &count1, &count2);
    if (error) goto Exit;

    error = ft_stroke_border_get_counts(stroker->borders + 1, &count3, &count4);
    if (error) goto Exit;

    num_points = count1 + count3;
    num_contours = count2 + count4;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;
}